

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::io::anon_unknown_0::
CordOutputStreamTest_DonatePartialCordBufferAndUseExtraCapacity_Test::TestBody
          (CordOutputStreamTest_DonatePartialCordBufferAndUseExtraCapacity_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined1 *puVar2;
  byte bVar3;
  undefined1 auVar4 [12];
  bool bVar5;
  undefined8 *puVar6;
  undefined8 extraout_RAX;
  sbyte sVar7;
  ulong uVar8;
  pointer *__ptr_1;
  uint uVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  sbyte sVar10;
  int iVar11;
  undefined1 *puVar12;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  int iVar13;
  char *pcVar14;
  pointer message;
  char *in_R9;
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *unaff_R14;
  pointer *__ptr;
  Span<char> SVar15;
  string_view fragment;
  int size;
  Cord cord;
  CordBuffer buffer;
  void *data;
  void *next_available_data;
  void *available_data;
  CordOutputStream output;
  undefined1 local_128 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_100;
  undefined1 *local_f8 [2];
  int local_e4;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_e0;
  long local_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [8];
  undefined1 auStack_b8 [16];
  void *pvStack_a8;
  undefined1 local_a0 [16];
  internal local_90 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  void *local_80;
  anon_union_16_2_b9f6da03_for_Rep_1 local_78;
  char *local_60;
  char *local_58;
  CordOutputStream local_50;
  
  auStack_b8._8_8_ = absl::lts_20250127::cord_internal::CordRepFlat::NewImpl<4096ul>(500);
  ((CordRep *)&((CordRep *)auStack_b8._8_8_)->length)->length = 0;
  if ((auStack_b8._8_8_ & 1) == 0) {
    SVar15 = absl::lts_20250127::CordBuffer::Rep::long_available((Rep *)(auStack_b8 + 8));
    auVar4 = SVar15._0_12_;
  }
  else {
    SVar15 = absl::lts_20250127::CordBuffer::Rep::short_available((Rep *)(auStack_b8 + 8));
    auVar4 = SVar15._0_12_;
  }
  local_58 = auVar4._0_8_;
  builtin_strncpy(local_58,
                  "aaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaaa"
                  ,100);
  if ((auStack_b8._8_8_ & 1) != 0) {
LAB_00b3ce6c:
    io::_GLOBAL__N_1::CordOutputStreamTest_DonatePartialCordBufferAndUseExtraCapacity_Test::TestBody
              ();
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a0);
    if (local_128 != (undefined1  [8])&local_118) {
      operator_delete((void *)local_128,local_118._M_allocated_capacity + 1);
    }
    if (local_e0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(undefined1 **)local_e0._M_head_impl + 8))();
    }
    if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()(unaff_R14,local_100);
    }
    absl::lts_20250127::Cord::~Cord((Cord *)local_c0);
    CordOutputStream::~CordOutputStream(&local_50);
    absl::lts_20250127::CordBuffer::~CordBuffer((CordBuffer *)(auStack_b8 + 8));
    _Unwind_Resume(extraout_RAX);
  }
  bVar3 = *(uint8_t *)(auStack_b8._8_8_ + 0xc);
  sVar10 = 0xc;
  if (bVar3 < 0xbb) {
    sVar10 = 6;
  }
  iVar13 = -0xb800d;
  if (bVar3 < 0xbb) {
    iVar13 = -0xe8d;
  }
  sVar7 = 3;
  if (0x42 < bVar3) {
    sVar7 = sVar10;
  }
  iVar11 = -0x1d;
  if (0x42 < bVar3) {
    iVar11 = iVar13;
  }
  uVar9 = ((uint)bVar3 << sVar7) + iVar11;
  if ((uVar9 < 100) ||
     (uVar8 = ((CordRep *)auStack_b8._8_8_)->length + 100, (ulong)(long)(int)uVar9 < uVar8))
  goto LAB_00b3ce6c;
  ((CordRep *)auStack_b8._8_8_)->length = uVar8;
  local_60 = local_58 + 100;
  local_78.long_rep.rep = (CordRepFlat *)auStack_b8._8_8_;
  local_78.long_rep.padding = pvStack_a8;
  auStack_b8[8] = 1;
  CordOutputStream::CordOutputStream(&local_50,(CordBuffer *)&local_78.long_rep,0);
  if (((ulong)local_78.long_rep.rep & 1) == 0) {
    absl::lts_20250127::cord_internal::CordRepFlat::Delete(&(local_78.long_rep.rep)->super_CordRep);
  }
  bVar5 = CordOutputStream::Next(&local_50,&local_80,&local_e4);
  local_108._M_head_impl._0_1_ = bVar5;
  local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar5) {
    testing::Message::Message((Message *)&local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_128,(internal *)&local_108,
               (AssertionResult *)"output.Next(&data, &size)","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x417,(char *)local_128);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_c0,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_c0);
    if (local_128 != (undefined1  [8])&local_118) {
      operator_delete((void *)local_128,local_118._M_allocated_capacity + 1);
    }
    if (local_e0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(undefined1 **)local_e0._M_head_impl + 8))();
    }
    if (local_100 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_100,local_100);
    }
  }
  testing::internal::CmpHelperEQ<void*,void*>
            ((internal *)local_128,"data","next_available_data",&local_80,&local_60);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (pbStack_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar14 = (pbStack_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x418,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  if (pbStack_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_120,pbStack_120);
  }
  local_108._M_head_impl._0_4_ = auVar4._8_4_ + -100;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_128,"size","static_cast<int>(available.size() - 100)",&local_e4,
             (int *)&local_108);
  if (local_128[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_108);
    if (pbStack_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar14 = anon_var_dwarf_a22956 + 5;
    }
    else {
      pcVar14 = (pbStack_120->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x419,pcVar14);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_108._M_head_impl + 8))();
    }
  }
  if (pbStack_120 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_120,pbStack_120);
  }
  memset(local_80,0x62,(long)local_e4);
  CordOutputStream::Consume((CordOutputStream *)local_c0);
  if ((Nonnull<CordRep_*>)auStack_b8._0_8_ == (Nonnull<CordRep_*>)0x0 || (local_c0[0] & 1) == 0) {
LAB_00b3ca8a:
    if ((Nonnull<CordRep_*>)auStack_b8._0_8_ == (Nonnull<CordRep_*>)0x0 || (local_c0[0] & 1) == 0) {
      if ((local_c0[0] & 1) == 0) {
        local_a0._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((ulong)(long)(char)local_c0[0] >> 1);
        local_a0._8_8_ =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_c0 + 1);
      }
      else {
        local_a0._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)((Nonnull<CordRep_*>)auStack_b8._0_8_)->length;
        local_a0._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
    }
    else {
      local_128 = (undefined1  [8])0x0;
      pbStack_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      absl::lts_20250127::Cord::GetFlatAux
                ((Nonnull<CordRep_*>)auStack_b8._0_8_,(Nonnull<absl::string_view_*>)local_128);
      local_a0._0_8_ = local_128;
      local_a0._8_8_ = pbStack_120;
    }
    local_108._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8;
    std::__cxx11::string::_M_construct((ulong)&local_108,'d');
    local_e0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0;
    std::__cxx11::string::_M_construct((ulong)&local_e0,(char)local_e4);
    puVar2 = (undefined1 *)((long)&(local_100->_M_dataplus)._M_p + local_d8);
    puVar12 = &DAT_0000000f;
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8) {
      puVar12 = local_f8[0];
    }
    if (puVar12 < puVar2) {
      puVar12 = &DAT_0000000f;
      if (local_e0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0) {
        puVar12 = local_d0[0];
      }
      if (puVar12 < puVar2) goto LAB_00b3cc1f;
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace
                         ((ulong)&local_e0,0,(char *)0x0,(ulong)local_108._M_head_impl);
    }
    else {
LAB_00b3cc1f:
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_108,(ulong)local_e0._M_head_impl);
    }
    local_128 = (undefined1  [8])&local_118;
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar6 == paVar1) {
      local_118._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_118._8_8_ = puVar6[3];
    }
    else {
      local_118._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_128 = (undefined1  [8])*puVar6;
    }
    pbStack_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)puVar6[1];
    *puVar6 = paVar1;
    puVar6[1] = 0;
    paVar1->_M_local_buf[0] = '\0';
    testing::internal::
    CmpHelperEQ<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string>
              (local_90,"flat",
               "std::string(100, \'a\') + std::string(static_cast<size_t>(size), \'b\')",
               (basic_string_view<char,_std::char_traits<char>_> *)local_a0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128);
    if (local_128 != (undefined1  [8])&local_118) {
      operator_delete((void *)local_128,local_118._M_allocated_capacity + 1);
    }
    if (local_e0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0) {
      operator_delete(local_e0._M_head_impl,(ulong)(local_d0[0] + 1));
    }
    if (local_108._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8) {
      operator_delete(local_108._M_head_impl,(ulong)(local_f8[0] + 1));
    }
    if (local_90[0] == (internal)0x0) {
      testing::Message::Message((Message *)local_128);
      if (local_88 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar14 = anon_var_dwarf_a22956 + 5;
      }
      else {
        pcVar14 = (local_88->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_108,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                 ,0x420,pcVar14);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_108,(Message *)local_128);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_108);
      if (local_128 != (undefined1  [8])0x0) {
        (**(code **)(*(size_type *)local_128 + 8))();
      }
    }
    if (local_88 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_88,local_88);
    }
    local_108._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0._8_8_;
    testing::internal::CmpHelperEQ<char_const*,void*>
              ((internal *)local_128,"flat.data()","available_data",(char **)&local_108,&local_58);
    if (local_128[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_108);
      if (pbStack_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = anon_var_dwarf_a22956 + 5;
      }
      else {
        message = (pbStack_120->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_e0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
                 ,0x421,message);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_e0,(Message *)&local_108);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_e0);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          local_108._M_head_impl !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_108._M_head_impl + 8))();
      }
    }
    if (pbStack_120 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00b3ce20;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&pbStack_120;
    __ptr_00 = pbStack_120;
  }
  else {
    local_128 = (undefined1  [8])0x0;
    pbStack_120 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    bVar5 = absl::lts_20250127::Cord::GetFlatAux
                      ((Nonnull<CordRep_*>)auStack_b8._0_8_,(Nonnull<absl::string_view_*>)local_128)
    ;
    if (bVar5) goto LAB_00b3ca8a;
    this_00 = (default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&local_100;
    local_108._M_head_impl = local_108._M_head_impl & 0xffffffffffffff00;
    local_100 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::Message::Message((Message *)&local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_128,(internal *)&local_108,(AssertionResult *)"cord.TryFlat()",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/zero_copy_stream_unittest.cc"
               ,0x41d,(char *)local_128);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_a0,(Message *)&local_e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_a0);
    if (local_128 != (undefined1  [8])&local_118) {
      operator_delete((void *)local_128,local_118._M_allocated_capacity + 1);
    }
    if (local_e0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(undefined1 **)local_e0._M_head_impl + 8))();
    }
    __ptr_00 = local_100;
    if (local_100 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    goto LAB_00b3ce20;
  }
  std::
  default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  operator()(this_00,__ptr_00);
LAB_00b3ce20:
  absl::lts_20250127::Cord::~Cord((Cord *)local_c0);
  if ((local_50.buffer_.rep_.field_0.short_rep.raw_size & 1U) == 0) {
    absl::lts_20250127::cord_internal::CordRepFlat::Delete
              ((CordRep *)
               CONCAT71(local_50.buffer_.rep_.field_0._1_7_,
                        local_50.buffer_.rep_.field_0.short_rep.raw_size));
  }
  absl::lts_20250127::Cord::~Cord(&local_50.cord_);
  if ((auStack_b8._8_8_ & 1) == 0) {
    absl::lts_20250127::cord_internal::CordRepFlat::Delete((CordRep *)auStack_b8._8_8_);
  }
  return;
}

Assistant:

bool IoTest::WriteToOutput(ZeroCopyOutputStream* output, const void* data,
                           int size) {
  const uint8_t* in = reinterpret_cast<const uint8_t*>(data);
  int in_size = size;

  void* out;
  int out_size;

  while (true) {
    if (!output->Next(&out, &out_size)) {
      return false;
    }
    EXPECT_GT(out_size, 0);

    if (in_size <= out_size) {
      memcpy(out, in, in_size);
      output->BackUp(out_size - in_size);
      return true;
    }

    memcpy(out, in, out_size);
    in += out_size;
    in_size -= out_size;
  }
}